

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeTestAndBranch(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t RegNo;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined4 local_34;
  int32_t dst;
  uint32_t bit;
  uint32_t Rt;
  void *Decoder_local;
  uint64_t Addr_local;
  uint32_t insn_local;
  MCInst *Inst_local;
  
  RegNo = fieldFromInstruction(insn,0,5);
  uVar1 = fieldFromInstruction(insn,0x1f,1);
  local_34 = fieldFromInstruction(insn,5,0xe);
  uVar2 = fieldFromInstruction(insn,0x13,5);
  if ((local_34 & 0x2000) != 0) {
    local_34 = local_34 | 0xffffc000;
  }
  uVar3 = fieldFromInstruction(insn,0x1f,1);
  if (uVar3 == 0) {
    DecodeGPR32RegisterClass(Inst,RegNo,Addr,Decoder);
  }
  else {
    DecodeGPR64RegisterClass(Inst,RegNo,Addr,Decoder);
  }
  MCOperand_CreateImm0(Inst,(ulong)(uVar2 | uVar1 << 5));
  MCOperand_CreateImm0(Inst,(long)(int)local_34);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeTestAndBranch(MCInst *Inst, uint32_t insn,
		uint64_t Addr, void *Decoder)
{
	uint32_t Rt = fieldFromInstruction(insn, 0, 5);
	uint32_t bit = fieldFromInstruction(insn, 31, 1) << 5;
	int32_t dst = fieldFromInstruction(insn, 5, 14);

	bit |= fieldFromInstruction(insn, 19, 5);

	// Sign-extend 14-bit immediate.
	if (dst & (1 << (14 - 1)))
		dst |= ~((1LL << 14) - 1);

	if (fieldFromInstruction(insn, 31, 1) == 0)
		DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
	else
		DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);

	MCOperand_CreateImm0(Inst, bit);
	//if (!Dis->tryAddingSymbolicOperand(Inst, dst << 2, Addr, true, 0, 4))
	MCOperand_CreateImm0(Inst, dst);

	return Success;
}